

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_do(Curl_easy *data,_Bool *done)

{
  CURLcode result;
  _Bool *done_local;
  Curl_easy *data_local;
  
  *done = false;
  data_local._4_4_ = imap_parse_url_path(data);
  if ((data_local._4_4_ == CURLE_OK) &&
     (data_local._4_4_ = imap_parse_custom_request(data), data_local._4_4_ == CURLE_OK)) {
    data_local._4_4_ = imap_regular_transfer(data,done);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode imap_do(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  *done = FALSE; /* default to false */

  /* Parse the URL path */
  result = imap_parse_url_path(data);
  if(result)
    return result;

  /* Parse the custom request */
  result = imap_parse_custom_request(data);
  if(result)
    return result;

  result = imap_regular_transfer(data, done);

  return result;
}